

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Keno::selectNumbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Keno *this)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  vector<int,_std::allocator<int>_> local_220;
  int local_204;
  size_type sStack_200;
  int i;
  size_t size;
  value_type_conflict2 local_1dc;
  int local_1d8;
  int local_1d4;
  int count;
  int currNumber;
  istringstream istr;
  string local_40 [8];
  string line;
  Keno *this_local;
  vector<int,_std::allocator<int>_> *selectNumbersBet;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"-----------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Input Numbers: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-----------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  line.field_2._M_local_buf[0xf] = '\0';
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  std::__cxx11::string::string(local_40);
  std::istream::ignore();
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_40);
  std::__cxx11::istringstream::istringstream((istringstream *)&count,local_40,8);
  local_1d4 = 0;
  while( true ) {
    plVar3 = (long *)std::istream::operator>>((istream *)&count,&local_1d4);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) break;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1d4);
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  for (local_1d8 = (int)sVar4; local_1d8 < 10; local_1d8 = local_1d8 + 1) {
    local_1dc = 0;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1dc);
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  if (10 < sVar4) {
    poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"The max selected numbers are 10!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    selectNumbers((vector<int,_std::allocator<int>_> *)&size,this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&size);
  }
  sStack_200 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  local_204 = 0;
  while( true ) {
    uVar5 = (ulong)local_204;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
    if (sVar4 <= uVar5) break;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_204);
    if (*pvVar6 == 0) {
      sStack_200 = sStack_200 - 1;
    }
    local_204 = local_204 + 1;
  }
  if (sStack_200 < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"The min selected numbers are 2!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    selectNumbers(&local_220,this);
    std::vector<int,_std::allocator<int>_>::~vector(&local_220);
  }
  line.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::istringstream::~istringstream((istringstream *)&count);
  std::__cxx11::string::~string(local_40);
  if ((line.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Keno::selectNumbers() {
	//std::cin.ignore();
	std::cout << "-----------------------------------------------" << std::endl;
	std::cout << "Input Numbers: " << std::endl;
	std::cout << "-----------------------------------------------" << std::endl;
	std::vector<int>selectNumbersBet;
	//selectNumbersBet.resize(10);

	std::string line;
	std::cin.ignore();
	getline(std::cin, line);
	
	std::istringstream istr(line);
	int currNumber = 0;
	while (istr >> currNumber) {
		selectNumbersBet.push_back(currNumber);
	}
	int count = selectNumbersBet.size();
	while (count < 10) {
		selectNumbersBet.push_back(0);
		count++;
	}
	if (selectNumbersBet.size() > 10) {
		std::cout << "---------------------------------"<< std::endl;
		std::cout << "The max selected numbers are 10!" << std::endl;
		std::cout << "---------------------------------" <<std::endl;
		selectNumbers();
	}
	size_t size = selectNumbersBet.size();
	for (int i = 0; i < selectNumbersBet.size(); i++) {
		if (selectNumbersBet[i] == 0) {
			size--;
		}
	}

	if (size < 2) {
		std::cout << "---------------------------------" << std::endl;
		std::cout << "The min selected numbers are 2!"   << std::endl;
		std::cout << "---------------------------------" << std::endl;
		selectNumbers();
	}

	/*for (int i = 0; i < selectNumbersBet.size(); ++i) {
		for (int j = 1; j < selectNumbersBet.size(); ++j) {
			if (selectNumbersBet[i] == selectNumbersBet[j]) {
				std::cout << "---------------------------------" << std::endl;
				std::cout << "The Numbers must NOT repeat!" << std::endl;
				std::cout << "---------------------------------" << std::endl;
				selectNumbers();
			}
		}
	}*/
	return selectNumbersBet;
}